

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_memory.c
# Opt level: O1

void freebytes(void *fatso,size_t nbytes)

{
  free(fatso);
  return;
}

Assistant:

void freebytes(void *fatso, size_t nbytes)
{
    if (nbytes == 0)
        nbytes = 1;
#ifdef LOUD
    fprintf(stderr, "free %lx %d\n", (int)fatso, nbytes);
#endif /* LOUD */
#ifdef DEBUGMEM
    totalmem -= nbytes;
#endif
    free(fatso);
}